

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcols.c
# Opt level: O0

int ffpcls(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          char **array,int *status)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  uint in_ESI;
  int *in_RDI;
  long in_R8;
  undefined8 *in_R9;
  fitsfile *in_stack_00000008;
  char *arrayptr;
  char *buffer;
  double cbuff [3600];
  tcolumn *colptr;
  char snull [20];
  char message [81];
  char *blanks;
  char tform [20];
  double zero;
  double scale;
  LONGLONG tnull;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG wrtptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  long ntodo;
  long jj;
  long ii;
  long incre;
  long twidth;
  int nchar;
  int hdutype;
  int maxelem;
  int tcode;
  int *piVar6;
  undefined1 *puVar7;
  size_t *psVar8;
  fitsfile *pfVar9;
  long *status_00;
  long *buffer_00;
  int *piVar10;
  undefined1 *puVar11;
  undefined1 *buffer_01;
  int *in_stack_ffffffffffff8d40;
  int *in_stack_ffffffffffff8d48;
  fitsfile *pfVar12;
  undefined8 in_stack_ffffffffffff8d50;
  fitsfile *in_stack_ffffffffffff8d58;
  undefined8 in_stack_ffffffffffff8da0;
  LONGLONG in_stack_ffffffffffff8da8;
  LONGLONG in_stack_ffffffffffff8db0;
  LONGLONG in_stack_ffffffffffff8db8;
  undefined8 in_stack_ffffffffffff8dc0;
  fitsfile *in_stack_ffffffffffff8dc8;
  char *local_7230;
  char local_7228 [8];
  double *in_stack_ffffffffffff8de0;
  fitsfile *in_stack_ffffffffffff8de8;
  char *in_stack_ffffffffffff8df0;
  long *in_stack_ffffffffffff8df8;
  int *in_stack_ffffffffffff8e00;
  int *in_stack_ffffffffffff8e08;
  LONGLONG *in_stack_ffffffffffff8e10;
  LONGLONG *in_stack_ffffffffffff8e18;
  long *in_stack_ffffffffffff8e20;
  LONGLONG *in_stack_ffffffffffff8e28;
  LONGLONG *in_stack_ffffffffffff8e30;
  int *in_stack_ffffffffffff8e38;
  LONGLONG *in_stack_ffffffffffff8e40;
  char *in_stack_ffffffffffff8e48;
  int *in_stack_ffffffffffff8e50;
  undefined1 local_198 [32];
  char local_178 [88];
  void *local_120;
  undefined1 local_118 [32];
  int local_f8 [4];
  undefined1 local_e8 [8];
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  size_t local_88;
  size_t local_80;
  undefined4 local_78;
  int local_74;
  int local_70;
  undefined1 local_6c [12];
  long local_60;
  uint local_44;
  int *local_40;
  int local_34;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffff8dc0 >> 0x20);
  iVar3 = (int)((ulong)in_stack_ffffffffffff8da0 >> 0x20);
  if (in_stack_00000008->HDUposition < 1) {
    local_6c._4_8_ = in_R9;
    local_60 = in_R8;
    local_44 = in_ESI;
    local_40 = in_RDI;
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_ffffffffffff8de8,(int *)in_stack_ffffffffffff8de0), 0 < iVar1)) {
        return in_stack_00000008->HDUposition;
      }
    }
    else {
      ffmahd(in_stack_ffffffffffff8d58,(int)((ulong)in_stack_ffffffffffff8d50 >> 0x20),
             in_stack_ffffffffffff8d48,in_stack_ffffffffffff8d40);
    }
    if (((int)local_44 < 1) || (*(int *)(*(long *)(local_40 + 2) + 0x3b0) < (int)local_44)) {
      snprintf(local_178,0x51,"Specified column number is out of range: %d",(ulong)local_44);
      ffpmsg((char *)0x22321c);
      in_stack_00000008->HDUposition = 0x12e;
      local_34 = 0x12e;
    }
    else {
      local_6c._0_4_ =
           *(int *)(*(long *)(*(long *)(local_40 + 2) + 0x3d0) + (long)(int)(local_44 - 1) * 0xa0 +
                   0x50);
      if (local_6c._0_4_ == -0x10) {
        sVar4 = strlen(*(char **)local_6c._4_8_);
        if (sVar4 == 0) {
          sVar4 = 1;
        }
        else {
          sVar4 = strlen(*(char **)local_6c._4_8_);
        }
        local_78 = (undefined4)sVar4;
        iVar3 = (int)((ulong)local_118 >> 0x20);
        puVar7 = local_198;
        piVar6 = local_f8;
        psVar8 = &local_80;
        pfVar9 = (fitsfile *)local_6c;
        piVar10 = &local_74;
        puVar11 = local_e8;
        pfVar12 = in_stack_00000008;
        iVar2 = ffgcprll(in_stack_ffffffffffff8dc8,(int)(sVar4 >> 0x20),(LONGLONG)in_stack_00000008,
                         (LONGLONG)&local_70,(LONGLONG)pfVar9,(int)((ulong)psVar8 >> 0x20),
                         in_stack_ffffffffffff8de0,(double *)in_stack_ffffffffffff8de8,
                         in_stack_ffffffffffff8df0,in_stack_ffffffffffff8df8,
                         in_stack_ffffffffffff8e00,in_stack_ffffffffffff8e08,
                         in_stack_ffffffffffff8e10,in_stack_ffffffffffff8e18,
                         in_stack_ffffffffffff8e20,in_stack_ffffffffffff8e28,
                         in_stack_ffffffffffff8e30,in_stack_ffffffffffff8e38,
                         in_stack_ffffffffffff8e40,in_stack_ffffffffffff8e48,
                         in_stack_ffffffffffff8e50);
        if (iVar2 < 1) {
          ffmbyt(pfVar9,(LONGLONG)psVar8,iVar3,piVar6);
          ffpbyt(pfVar12,(LONGLONG)puVar7,puVar11,piVar10);
          if (0 < in_stack_00000008->HDUposition) {
            snprintf(local_178,0x51,"Error writing to variable length string column (ffpcls).");
            ffpmsg((char *)0x2234da);
          }
          local_34 = in_stack_00000008->HDUposition;
        }
        else {
          local_34 = in_stack_00000008->HDUposition;
        }
      }
      else if (local_6c._0_4_ == 0x10) {
        puVar7 = local_118;
        puVar11 = local_198;
        piVar6 = local_f8;
        psVar8 = &local_80;
        pfVar9 = (fitsfile *)local_6c;
        status_00 = &local_a8;
        buffer_00 = &local_c8;
        piVar10 = &local_74;
        buffer_01 = local_e8;
        pfVar12 = in_stack_00000008;
        iVar3 = ffgcprll(in_stack_ffffffffffff8dc8,iVar2,in_stack_ffffffffffff8db8,
                         in_stack_ffffffffffff8db0,in_stack_ffffffffffff8da8,iVar3,
                         in_stack_ffffffffffff8de0,(double *)in_stack_ffffffffffff8de8,
                         in_stack_ffffffffffff8df0,in_stack_ffffffffffff8df8,
                         in_stack_ffffffffffff8e00,in_stack_ffffffffffff8e08,
                         in_stack_ffffffffffff8e10,in_stack_ffffffffffff8e18,
                         in_stack_ffffffffffff8e20,in_stack_ffffffffffff8e28,
                         in_stack_ffffffffffff8e30,in_stack_ffffffffffff8e38,
                         in_stack_ffffffffffff8e40,in_stack_ffffffffffff8e48,
                         in_stack_ffffffffffff8e50);
        if (iVar3 < 1) {
          if (0xb40 < (long)local_80) {
            local_70 = 1;
            local_88 = local_80;
            local_a8 = 1;
          }
          local_120 = malloc(local_80);
          if (local_120 == (void *)0x0) {
            ffpmsg((char *)0x2236ce);
            in_stack_00000008->HDUposition = 0x6f;
            local_34 = 0x6f;
          }
          else {
            for (local_90 = 0; local_90 < (long)local_80; local_90 = local_90 + 1) {
              *(undefined1 *)((long)local_120 + local_90) = 0x20;
            }
            local_d8 = local_60;
            local_e0 = 0;
            local_d0 = 0;
            while (local_d8 != 0) {
              local_a0 = local_d8;
              if (local_70 <= local_d8) {
                local_a0 = (long)local_70;
              }
              if (local_a8 - local_b8 <= local_a0) {
                local_a0 = local_a8 - local_b8;
              }
              local_c0 = local_b0 + local_d0 * local_c8 + local_b8 * local_88;
              ffmbyt(pfVar9,(LONGLONG)psVar8,(int)((ulong)puVar7 >> 0x20),piVar6);
              local_7230 = local_7228;
              for (local_90 = 0; local_90 < local_a0; local_90 = local_90 + 1) {
                pcVar5 = *(char **)(local_6c._4_8_ + local_e0 * 8);
                local_98 = 0;
                for (; (local_98 < (long)local_80 && (*pcVar5 != '\0')); pcVar5 = pcVar5 + 1) {
                  *local_7230 = *pcVar5;
                  local_7230 = local_7230 + 1;
                  local_98 = local_98 + 1;
                }
                for (; local_98 < (long)local_80; local_98 = local_98 + 1) {
                  *local_7230 = ' ';
                  local_7230 = local_7230 + 1;
                }
                local_e0 = local_e0 + 1;
              }
              if (local_88 == local_80) {
                ffpbyt(pfVar12,(LONGLONG)puVar11,buffer_01,piVar10);
              }
              else {
                ffpbytoff(pfVar12,(long)puVar11,(long)buffer_01,(long)piVar10,buffer_00,
                          (int *)status_00);
              }
              if (0 < in_stack_00000008->HDUposition) {
                snprintf(local_178,0x51,
                         "Error writing elements %.0f thru %.0f of input data array (ffpcls).",
                         (double)(local_e0 + 1),(double)(local_e0 + local_a0));
                ffpmsg((char *)0x223a9d);
                if (local_120 != (void *)0x0) {
                  free(local_120);
                }
                return in_stack_00000008->HDUposition;
              }
              local_d8 = local_d8 - local_a0;
              if ((local_d8 != 0) && (local_b8 = local_a0 + local_b8, local_b8 == local_a8)) {
                local_b8 = 0;
                local_d0 = local_d0 + 1;
              }
            }
            if (local_120 != (void *)0x0) {
              free(local_120);
            }
            local_34 = in_stack_00000008->HDUposition;
          }
        }
        else {
          local_34 = in_stack_00000008->HDUposition;
        }
      }
      else {
        in_stack_00000008->HDUposition = 0x135;
        local_34 = 0x135;
      }
    }
  }
  else {
    local_34 = in_stack_00000008->HDUposition;
  }
  return local_34;
}

Assistant:

int ffpcls( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of strings to write              */
            char  **array,   /* I - array of pointers to strings            */
            int  *status)    /* IO - error status                           */
/*
  Write an array of string values to a column in the current FITS HDU.
*/
{
    int tcode, maxelem, hdutype, nchar;
    long twidth, incre;
    long ii, jj, ntodo;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, tnull;
    double scale, zero;
    char tform[20], *blanks;
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */
    tcolumn *colptr;

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    char *buffer, *arrayptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);
    }

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        return(*status = BAD_COL_NUM);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    tcode = colptr->tdatatype;

    if (tcode == -TSTRING) /* variable length column in a binary table? */
    {
      /* only write a single string; ignore value of firstelem */
      nchar = maxvalue(1,strlen(array[0])); /* will write at least 1 char */
                                          /* even if input string is null */

      if (ffgcprll( fptr, colnum, firstrow, 1, nchar, 1, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);
	
      /* simply move to write position, then write the string */
      ffmbyt(fptr, startpos, IGNORE_EOF, status); 
      ffpbyt(fptr, nchar, array[0], status);

      if (*status > 0)  /* test for error during previous write operation */
      {
         snprintf(message,FLEN_ERRMSG,
          "Error writing to variable length string column (ffpcls).");
         ffpmsg(message);
      }

      return(*status);
    }
    else if (tcode == TSTRING)
    {
      if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 1, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

      /* if string length is greater than a FITS block (2880 char) then must */
      /* only write 1 string at a time, to force writein by ffpbyt instead of */
      /* ffpbytoff (ffpbytoff can't handle this case) */
      if (twidth > IOBUFLEN) {
        maxelem = 1;
        incre = twidth;
        repeat = 1;
      }   

      blanks = (char *) malloc(twidth); /* string for blank fill values */
      if (!blanks)
      {
        ffpmsg("Could not allocate memory for string (ffpcls)");
        return(*status = ARRAY_TOO_BIG);
      }

      for (ii = 0; ii < twidth; ii++)
          blanks[ii] = ' ';          /* fill string with blanks */

      remain = nelem;           /* remaining number of values to write  */
    }
    else 
      return(*status = NOT_ASCII_COL);
 
    /*-------------------------------------------------------*/
    /*  Now write the strings to the FITS column.            */
    /*-------------------------------------------------------*/

    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */

    while (remain)
    {
      /* limit the number of pixels to process at one time to the number that
         will fit in the buffer space or to the number of pixels that remain
         in the current vector, which ever is smaller.
      */
      ntodo = (long) minvalue(remain, maxelem);      
      ntodo = (long) minvalue(ntodo, (repeat - elemnum));

      wrtptr = startpos + (rownum * rowlen) + (elemnum * incre);
      ffmbyt(fptr, wrtptr, IGNORE_EOF, status);  /* move to write position */

      buffer = (char *) cbuff;

      /* copy the user's strings into the buffer */
      for (ii = 0; ii < ntodo; ii++)
      {
         arrayptr = array[next];

         for (jj = 0; jj < twidth; jj++)  /*  copy the string, char by char */
         {
            if (*arrayptr)
            {
              *buffer = *arrayptr;
              buffer++;
              arrayptr++;
            }
            else
              break;
         }

         for (;jj < twidth; jj++)    /* fill field with blanks, if needed */
         {
           *buffer = ' ';
           buffer++;
         }

         next++;
      }

      /* write the buffer full of strings to the FITS file */
      if (incre == twidth)
         ffpbyt(fptr, ntodo * twidth, cbuff, status);
      else
         ffpbytoff(fptr, twidth, ntodo, incre - twidth, cbuff, status);

      if (*status > 0)  /* test for error during previous write operation */
      {
         snprintf(message,FLEN_ERRMSG,
          "Error writing elements %.0f thru %.0f of input data array (ffpcls).",
             (double) (next+1), (double) (next+ntodo));
         ffpmsg(message);

         if (blanks)
           free(blanks);

         return(*status);
      }

      /*--------------------------------------------*/
      /*  increment the counters for the next loop  */
      /*--------------------------------------------*/
      remain -= ntodo;
      if (remain)
      {
          elemnum += ntodo;
          if (elemnum == repeat)  /* completed a row; start on next row */
          {
              elemnum = 0;
              rownum++;
          }
       }
    }  /*  End of main while Loop  */

    if (blanks)
      free(blanks);

    return(*status);
}